

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

void __thiscall
pybind11::detail::list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>::
list_caster(list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char> *this)

{
  list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char> *this_local;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->value);
  return;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value_conv conv;
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value>(conv));
        }
        return true;
    }